

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContextStdioStream::ValidationContextStdioStream
          (ValidationContextStdioStream *this,bool warningsAsErrors,bool GLTFBasisU,
          function<void_(const_ktx::ValidationReport_&)> *callback,FILE *file,string *filepath)

{
  _Manager_type p_Var1;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  local_50 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var1;
  }
  ValidationContext::ValidationContext
            (&this->super_ValidationContext,warningsAsErrors,GLTFBasisU,
             (function<void_(const_ktx::ValidationReport_&)> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  (this->super_ValidationContext)._vptr_ValidationContext =
       (_func_int **)&PTR__ValidationContext_00242b30;
  this->file = file;
  if (file == (FILE *)0x0) {
    errnoMessage_abi_cxx11_();
    ValidationContext::fatal<std::__cxx11::string_const&,std::__cxx11::string>
              (&this->super_ValidationContext,&IOError::FileOpen,filepath,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

ValidationContextStdioStream(bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback, FILE* file, const std::string& filepath) :
        ValidationContext(warningsAsErrors, GLTFBasisU, std::move(callback)),
        file(file) {

        if (!file)
            fatal(IOError::FileOpen, filepath, errnoMessage());
    }